

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O2

void __thiscall tcpp::Lexer::PushStream(Lexer *this,TInputStreamUniquePtr *stream)

{
  if ((stream->_M_t).
      super___uniq_ptr_impl<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>._M_t.
      super__Tuple_impl<0UL,_tcpp::IInputStream_*,_std::default_delete<tcpp::IInputStream>_>.
      super__Head_base<0UL,_tcpp::IInputStream_*,_false>._M_head_impl != (IInputStream *)0x0) {
    std::
    deque<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>,std::allocator<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>>>
    ::emplace_back<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>>
              ((deque<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>,std::allocator<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>>>
                *)&this->mStreamsContext,stream);
    return;
  }
  __assert_fail("stream",
                "/workspace/llm4binary/github/license_c_cmakelists/bnoazx005[P]tcpp/tests/../source/tcppLibrary.hpp"
                ,0x224,"void tcpp::Lexer::PushStream(TInputStreamUniquePtr)");
}

Assistant:

void Lexer::PushStream(TInputStreamUniquePtr stream) TCPP_NOEXCEPT
	{
		TCPP_ASSERT(stream);

		if (!stream)
		{
			return;
		}

		mStreamsContext.push(std::move(stream));
	}